

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi_is_16_bit_from_callbacks(stbi_io_callbacks *c,void *user)

{
  int iVar1;
  undefined1 local_f0 [8];
  stbi__context s;
  
  stbi__start_callbacks((stbi__context *)local_f0,c,user);
  iVar1 = stbi__is_16_main((stbi__context *)local_f0);
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_16_bit_from_callbacks(stbi_io_callbacks const *c, void *user)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) c, user);
   return stbi__is_16_main(&s);
}